

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

char * lj_buf_more2(SBuf *sb,MSize sz)

{
  uint uVar1;
  int iVar2;
  MSize len_1;
  MSize len;
  SBufExt *sbx;
  MSize sz_local;
  SBuf *sb_local;
  
  if (((sb->L).ptr64 & 1) == 0) {
    iVar2 = (int)sb->w - (int)sb->b;
    if (0x7fffff00 < sz || 0x7fffff00 < iVar2 + sz) {
      lj_err_mem((lua_State *)((sb->L).ptr64 & 0xfffffffffffffff8));
    }
    buf_grow(sb,iVar2 + sz);
  }
  else {
    uVar1 = (int)sb->w - (int)sb[1].e;
    if (0x7fffff00 < sz || 0x7fffff00 < uVar1 + sz) {
      lj_err_mem((lua_State *)((sb->L).ptr64 & 0xfffffffffffffff8));
    }
    if ((uint)((int)sb->e - (int)sb->b) < uVar1 + sz) {
      buf_grow(sb,uVar1 + sz);
    }
    else if ((uint)((int)sb[1].e - (int)sb->b) < (uint)((int)sb->e - (int)sb->b) >> 3) {
      buf_grow(sb,((int)sb->w - (int)sb->b) + sz);
      return sb->w;
    }
    if (sb[1].e != sb->b) {
      memmove(sb->b,sb[1].e,(ulong)uVar1);
      sb[1].e = sb->b;
      sb->w = sb->b + uVar1;
    }
  }
  return sb->w;
}

Assistant:

LJ_NOINLINE char *LJ_FASTCALL lj_buf_more2(SBuf *sb, MSize sz)
{
  if (sbufisext(sb)) {
    SBufExt *sbx = (SBufExt *)sb;
    MSize len = sbufxlen(sbx);
    if (LJ_UNLIKELY(sz > LJ_MAX_BUF || len + sz > LJ_MAX_BUF))
      lj_err_mem(sbufL(sbx));
    if (len + sz > sbufsz(sbx)) {  /* Must grow. */
      buf_grow((SBuf *)sbx, len + sz);
    } else if (sbufxslack(sbx) < (sbufsz(sbx) >> 3)) {
      /* Also grow to avoid excessive compactions, if slack < size/8. */
      buf_grow((SBuf *)sbx, sbuflen(sbx) + sz);  /* Not sbufxlen! */
      return sbx->w;
    }
    if (sbx->r != sbx->b) {  /* Compact by moving down. */
      memmove(sbx->b, sbx->r, len);
      sbx->r = sbx->b;
      sbx->w = sbx->b + len;
      lj_assertG_(G(sbufL(sbx)), len + sz <= sbufsz(sbx), "bad SBuf compact");
    }
  } else {
    MSize len = sbuflen(sb);
    lj_assertG_(G(sbufL(sb)), sz > sbufleft(sb), "SBuf overflow");
    if (LJ_UNLIKELY(sz > LJ_MAX_BUF || len + sz > LJ_MAX_BUF))
      lj_err_mem(sbufL(sb));
    buf_grow(sb, len + sz);
  }
  return sb->w;
}